

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

char * upb_MtDataEncoder_EncodeExtension
                 (upb_MtDataEncoder *e,char *ptr,upb_FieldType type,uint32_t field_num,
                 uint64_t field_mod)

{
  char ch;
  char cVar1;
  uint uVar2;
  char *pcVar3;
  
  *(char **)e->internal = ptr;
  e->internal[8] = '\0';
  e->internal[9] = '\0';
  e->internal[10] = '\0';
  e->internal[0xb] = '\0';
  e->internal[0xc] = '\0';
  e->internal[0xd] = '\0';
  e->internal[0xe] = '\0';
  e->internal[0xf] = '\0';
  e->internal[0x10] = '\0';
  e->internal[0x11] = '\0';
  e->internal[0x12] = '\0';
  e->internal[0x13] = '\0';
  e->internal[0x14] = '\0';
  e->internal[0x15] = '\0';
  e->internal[0x16] = '\0';
  e->internal[0x17] = '\0';
  if (e->end == ptr) {
    pcVar3 = (char *)0x0;
  }
  else {
    *ptr = '#';
    pcVar3 = ptr + 1;
  }
  if (pcVar3 == (char *)0x0) {
    return (char *)0x0;
  }
  *(char **)e->internal = pcVar3;
  uVar2 = *(uint *)(e->internal + 0x10);
  if ((field_num < uVar2 || field_num - uVar2 == 0) ||
     ((uVar2 + 1 != field_num &&
      (pcVar3 = upb_MtDataEncoder_PutBase92Varint(e,pcVar3,field_num - uVar2,0x5f,0x7e),
      pcVar3 == (char *)0x0)))) {
    pcVar3 = (char *)0x0;
  }
  else {
    *(uint32_t *)(e->internal + 0x10) = field_num;
  }
  if (pcVar3 != (char *)0x0) {
    if ((field_mod & 4) == 0) {
      cVar1 = _upb_MtDataEncoder_PutFieldType_kUpb_TypeToEncoded[type];
    }
    else {
      cVar1 = '\x12';
      if (type != kUpb_FieldType_Enum) {
        __assert_fail("type == kUpb_FieldType_Enum",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                      ,0xb8,
                      "char *_upb_MtDataEncoder_PutFieldType(upb_MtDataEncoder *, char *, upb_FieldType, uint64_t)"
                     );
      }
    }
    ch = cVar1 + '\x14';
    if ((field_mod & 1) == 0) {
      ch = cVar1;
    }
    pcVar3 = upb_MtDataEncoder_Put(e,pcVar3,ch);
    if (pcVar3 != (char *)0x0) {
      uVar2 = 0;
      if (((field_mod & 1) != 0) &&
         (uVar2 = 0,
         (0xffffe1ffU >> (type & (kUpb_FieldType_SFixed64|kUpb_FieldType_SFixed32)) & 1) != 0)) {
        uVar2 = (*(uint *)(e->internal + 8) ^ (uint)field_mod) >> 1 & 1;
      }
      if ((type == kUpb_FieldType_String) &&
         (((uint)(field_mod >> 5) & 1) != ((uint)*(ulong *)(e->internal + 8) & 1))) {
        if ((*(ulong *)(e->internal + 8) & 1) != 0) {
          __assert_fail("!message_validates_utf8",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mini_descriptor/internal/encode.c"
                        ,0xdc,
                        "char *_upb_MtDataEncoder_MaybePutModifiers(upb_MtDataEncoder *, char *, upb_FieldType, uint64_t)"
                       );
        }
        uVar2 = uVar2 | 8;
      }
      uVar2 = (uint)field_mod >> 3 & 2 | (uint)(field_mod >> 1) & 4 | uVar2;
      if (uVar2 == 0) {
        return pcVar3;
      }
      pcVar3 = upb_MtDataEncoder_PutBase92Varint(e,pcVar3,uVar2,0x4c,0x5b);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char* upb_MtDataEncoder_EncodeExtension(upb_MtDataEncoder* e, char* ptr,
                                        upb_FieldType type, uint32_t field_num,
                                        uint64_t field_mod) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  in->state.msg_state.msg_modifiers = 0;
  in->state.msg_state.last_field_num = 0;
  in->state.msg_state.oneof_state = kUpb_OneofState_NotStarted;

  ptr = upb_MtDataEncoder_PutRaw(e, ptr, kUpb_EncodedVersion_ExtensionV1);
  if (!ptr) return NULL;

  return upb_MtDataEncoder_PutField(e, ptr, type, field_num, field_mod);
}